

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVector<llvm::SMFixIt,_4U>::~SmallVector(SmallVector<llvm::SMFixIt,_4U> *this)

{
  ulong uVar1;
  undefined1 *__ptr;
  long lVar2;
  
  __ptr = (undefined1 *)
          (this->super_SmallVectorImpl<llvm::SMFixIt>).
          super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
          super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  uVar1 = (ulong)(this->super_SmallVectorImpl<llvm::SMFixIt>).
                 super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
                 super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.Size;
  if (uVar1 != 0) {
    lVar2 = uVar1 * 0x30;
    do {
      if ((long *)(__ptr + lVar2 + -0x10) != *(long **)(__ptr + lVar2 + -0x20)) {
        operator_delete(*(long **)(__ptr + lVar2 + -0x20),*(long *)(__ptr + lVar2 + -0x10) + 1);
      }
      lVar2 = lVar2 + -0x30;
    } while (lVar2 != 0);
    __ptr = (undefined1 *)
            (this->super_SmallVectorImpl<llvm::SMFixIt>).
            super_SmallVectorTemplateBase<llvm::SMFixIt,_false>.
            super_SmallVectorTemplateCommon<llvm::SMFixIt,_void>.super_SmallVectorBase.BeginX;
  }
  if ((SmallVectorStorage<llvm::SMFixIt,_4U> *)__ptr !=
      &this->super_SmallVectorStorage<llvm::SMFixIt,_4U>) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

~SmallVector() {
    // Destroy the constructed elements in the vector.
    this->destroy_range(this->begin(), this->end());
  }